

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O2

void __thiscall Assimp::STEP::DB::InternInsert(DB *this,LazyObject *lz)

{
  mapped_type *ppLVar1;
  iterator iVar2;
  allocator<char> local_41;
  LazyObject *local_40;
  key_type local_38;
  
  local_38._M_dataplus._M_p = (pointer)lz->id;
  local_40 = lz;
  ppLVar1 = std::
            map<unsigned_long,_const_Assimp::STEP::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::STEP::LazyObject_*>_>_>
            ::operator[](&this->objects,(key_type_conflict1 *)&local_38);
  *ppLVar1 = lz;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,lz->type,&local_41);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
          ::find(&(this->objects_bytype)._M_t,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->objects_bytype)._M_t._M_impl.super__Rb_tree_header
     ) {
    std::
    _Rb_tree<Assimp::STEP::LazyObject_const*,Assimp::STEP::LazyObject_const*,std::_Identity<Assimp::STEP::LazyObject_const*>,std::less<Assimp::STEP::LazyObject_const*>,std::allocator<Assimp::STEP::LazyObject_const*>>
    ::_M_insert_unique<Assimp::STEP::LazyObject_const*const&>
              ((_Rb_tree<Assimp::STEP::LazyObject_const*,Assimp::STEP::LazyObject_const*,std::_Identity<Assimp::STEP::LazyObject_const*>,std::less<Assimp::STEP::LazyObject_const*>,std::allocator<Assimp::STEP::LazyObject_const*>>
                *)(iVar2._M_node + 2),&local_40);
  }
  return;
}

Assistant:

void InternInsert(const LazyObject* lz) {
            objects[lz->GetID()] = lz;

            const ObjectMapByType::iterator it = objects_bytype.find( lz->type );
            if (it != objects_bytype.end()) {
                (*it).second.insert(lz);
            }
        }